

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCoding.h
# Opt level: O0

ssize_t __thiscall
llbuild::basic::BinaryEncoder::write(BinaryEncoder *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  void *__buf_00;
  uint32_t value_local;
  BinaryEncoder *this_local;
  
  write(this,__fd & 0xffff,__buf,__n);
  sVar1 = write(this,(uint)__fd >> 0x10,__buf_00,__n);
  return sVar1;
}

Assistant:

void write(uint32_t value) {
    write(uint16_t(value >> 0));
    write(uint16_t(value >> 16));
  }